

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.cpp
# Opt level: O1

bool GetScriptOp(const_iterator *pc,const_iterator end,opcodetype *opcodeRet,
                vector<unsigned_char,_std::allocator<unsigned_char>_> *pvchRet)

{
  byte bVar1;
  long lVar2;
  pointer puVar3;
  uchar *puVar4;
  bool bVar5;
  const_iterator copy;
  byte *pbVar6;
  int iVar7;
  uint uVar8;
  opcodetype oVar9;
  int iVar10;
  uint uVar11;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  *opcodeRet = OP_INVALIDOPCODE;
  if ((pvchRet != (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0) &&
     (puVar3 = (pvchRet->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start,
     (pvchRet->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
     super__Vector_impl_data._M_finish != puVar3)) {
    (pvchRet->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
    super__Vector_impl_data._M_finish = puVar3;
  }
  pbVar6 = pc->ptr;
  if ((end.ptr <= pbVar6) || (iVar10 = (int)end.ptr, iVar10 - (int)pbVar6 < 1)) goto LAB_00776a26;
  pc->ptr = pbVar6 + 1;
  bVar1 = *pbVar6;
  uVar8 = (uint)bVar1;
  oVar9 = (opcodetype)bVar1;
  if (uVar8 < 0x4f) {
    if (0x4b < bVar1) {
      iVar7 = iVar10 - (int)(pbVar6 + 1);
      if (oVar9 == OP_PUSHDATA2) {
        if (1 < iVar7) {
          uVar8 = (uint)*(ushort *)(pbVar6 + 1);
          pbVar6 = pbVar6 + 3;
LAB_00776a31:
          pc->ptr = pbVar6;
          goto LAB_00776a34;
        }
      }
      else if (oVar9 == OP_PUSHDATA1) {
        if (0 < iVar7) {
          pc->ptr = pbVar6 + 2;
          uVar8 = (uint)pbVar6[1];
          goto LAB_00776a34;
        }
      }
      else if (3 < iVar7) {
        uVar8 = *(uint *)(pbVar6 + 1);
        pbVar6 = pbVar6 + 5;
        goto LAB_00776a31;
      }
LAB_00776a26:
      bVar5 = false;
      goto LAB_00776a60;
    }
LAB_00776a34:
    puVar4 = pc->ptr;
    uVar11 = iVar10 - (int)puVar4;
    bVar5 = false;
    if (((int)uVar11 < 0) || (bVar5 = false, uVar11 < uVar8)) goto LAB_00776a60;
    if (pvchRet != (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0) {
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      _M_assign_aux<prevector<28u,unsigned_char,unsigned_int,int>::const_iterator>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)pvchRet,puVar4,
                 puVar4 + uVar8);
    }
    pc->ptr = pc->ptr + uVar8;
  }
  *opcodeRet = oVar9;
  bVar5 = true;
LAB_00776a60:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return bVar5;
  }
  __stack_chk_fail();
}

Assistant:

bool GetScriptOp(CScriptBase::const_iterator& pc, CScriptBase::const_iterator end, opcodetype& opcodeRet, std::vector<unsigned char>* pvchRet)
{
    opcodeRet = OP_INVALIDOPCODE;
    if (pvchRet)
        pvchRet->clear();
    if (pc >= end)
        return false;

    // Read instruction
    if (end - pc < 1)
        return false;
    unsigned int opcode = *pc++;

    // Immediate operand
    if (opcode <= OP_PUSHDATA4)
    {
        unsigned int nSize = 0;
        if (opcode < OP_PUSHDATA1)
        {
            nSize = opcode;
        }
        else if (opcode == OP_PUSHDATA1)
        {
            if (end - pc < 1)
                return false;
            nSize = *pc++;
        }
        else if (opcode == OP_PUSHDATA2)
        {
            if (end - pc < 2)
                return false;
            nSize = ReadLE16(&pc[0]);
            pc += 2;
        }
        else if (opcode == OP_PUSHDATA4)
        {
            if (end - pc < 4)
                return false;
            nSize = ReadLE32(&pc[0]);
            pc += 4;
        }
        if (end - pc < 0 || (unsigned int)(end - pc) < nSize)
            return false;
        if (pvchRet)
            pvchRet->assign(pc, pc + nSize);
        pc += nSize;
    }

    opcodeRet = static_cast<opcodetype>(opcode);
    return true;
}